

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forms_compatability.cxx
# Opt level: O0

void fl_show_form(Fl_Window *f,int place,int b,char *n)

{
  Fl_Window *pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fl_Widget *pFVar5;
  int local_6c;
  int local_5c;
  int local_30;
  int local_2c;
  int scr_h;
  int scr_w;
  int scr_y;
  int scr_x;
  char *n_local;
  int b_local;
  int place_local;
  Fl_Window *f_local;
  
  _scr_y = n;
  n_local._0_4_ = b;
  n_local._4_4_ = place;
  _b_local = f;
  Fl_Window::label(f,n);
  if ((int)n_local == 0) {
    Fl_Window::clear_border(_b_local);
  }
  if ((fl_modal_next != '\0') || ((int)n_local == 2)) {
    Fl_Window::set_modal(_b_local);
    fl_modal_next = '\0';
  }
  if ((n_local._4_4_ & 1) != 0) {
    Fl_Window::hotspot(_b_local,(Fl_Widget *)_b_local,0);
  }
  if ((n_local._4_4_ & 2) != 0) {
    Fl::screen_xywh(&scr_w,&scr_h,&local_2c,&local_30);
    pFVar1 = _b_local;
    iVar2 = Fl_Widget::w((Fl_Widget *)_b_local);
    iVar3 = Fl_Widget::h((Fl_Widget *)_b_local);
    Fl_Widget::position((Fl_Widget *)pFVar1,scr_w + (local_2c - iVar2) / 2,
                        scr_h + (local_30 - iVar3) / 2);
  }
  if ((n_local._4_4_ & 0x40) != 0) {
    Fl_Window::fullscreen(_b_local);
  }
  pFVar1 = _b_local;
  if ((n_local._4_4_ & 0x14) != 0) {
    iVar2 = Fl_Widget::x((Fl_Widget *)_b_local);
    if (iVar2 < 0) {
      iVar2 = Fl::w();
      iVar3 = Fl_Widget::w((Fl_Widget *)_b_local);
      iVar4 = Fl_Widget::x((Fl_Widget *)_b_local);
      local_5c = (iVar2 - iVar3) + iVar4 + -1;
    }
    else {
      local_5c = Fl_Widget::x((Fl_Widget *)_b_local);
    }
    iVar2 = Fl_Widget::y((Fl_Widget *)_b_local);
    if (iVar2 < 0) {
      iVar2 = Fl::h();
      iVar3 = Fl_Widget::h((Fl_Widget *)_b_local);
      iVar4 = Fl_Widget::y((Fl_Widget *)_b_local);
      local_6c = (iVar2 - iVar3) + iVar4 + -1;
    }
    else {
      local_6c = Fl_Widget::y((Fl_Widget *)_b_local);
    }
    Fl_Widget::position((Fl_Widget *)pFVar1,local_5c,local_6c);
  }
  if ((n_local._4_4_ == 0) || (n_local._4_4_ == 8)) {
    Fl_Window::free_position(_b_local);
  }
  if (((n_local._4_4_ == 0) || ((n_local._4_4_ & 0x4000) != 0)) &&
     (pFVar5 = Fl_Group::resizable(&_b_local->super_Fl_Group), pFVar5 == (Fl_Widget *)0x0)) {
    Fl_Group::resizable(&_b_local->super_Fl_Group,(Fl_Widget *)_b_local);
  }
  if (initargc == 0) {
    (*(_b_local->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])();
  }
  else {
    Fl_Window::show(_b_local,initargc,initargv);
    initargc = 0;
  }
  return;
}

Assistant:

void fl_show_form(Fl_Window *f,int place,int b,const char *n) {

  f->label(n);
  if (!b) f->clear_border();
  if (fl_modal_next || b==FL_TRANSIENT) {f->set_modal(); fl_modal_next = 0;}

  if (place & FL_PLACE_MOUSE) f->hotspot(f);

  if (place & FL_PLACE_CENTER) {
    int scr_x, scr_y, scr_w, scr_h;
    Fl::screen_xywh(scr_x, scr_y, scr_w, scr_h);
    f->position(scr_x+(scr_w-f->w())/2, scr_y+(scr_h-f->h())/2);
  }

  if (place & FL_PLACE_FULLSCREEN)
    f->fullscreen();

  if (place & (FL_PLACE_POSITION | FL_PLACE_GEOMETRY))
    f->position(
      (f->x() < 0) ? Fl::w()-f->w()+f->x()-1 : f->x(),
      (f->y() < 0) ? Fl::h()-f->h()+f->y()-1 : f->y());

// if (place & FL_PLACE_ASPECT) {
// this is not yet implemented
// it can be done by setting size_range().

  if (place == FL_PLACE_FREE || place == FL_PLACE_SIZE)
    f->free_position();

  if (place == FL_PLACE_FREE || place & FL_FREE_SIZE)
    if (!f->resizable()) f->resizable(f);

  if (initargc) {f->show(initargc,initargv); initargc = 0;}
  else f->show();
}